

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O1

int on_stream_close_callback
              (nghttp2_session *session,int32_t stream_id,uint32_t error_code,void *user_data)

{
  int iVar1;
  http2_session_data *session_data;
  
  if (*(int *)(*(long *)((long)user_data + 0x18) + 0x30) == stream_id) {
    fprintf(_stderr,"Stream %d closed with error_code=%u\n",(ulong)(uint)stream_id,error_code);
    iVar1 = nghttp2_session_terminate_session(session,0);
    if (iVar1 != 0) {
      return -0x386;
    }
  }
  return 0;
}

Assistant:

static int on_stream_close_callback(nghttp2_session *session, int32_t stream_id,
                                    uint32_t error_code, void *user_data) {
  http2_session_data *session_data = (http2_session_data *)user_data;
  int rv;

  if (session_data->stream_data->stream_id == stream_id) {
    fprintf(stderr, "Stream %d closed with error_code=%u\n", stream_id,
            error_code);
    rv = nghttp2_session_terminate_session(session, NGHTTP2_NO_ERROR);
    if (rv != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return 0;
}